

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O1

Test * anon_unknown.dwarf_1029e4::DiskInterfaceTestStatBadPath::Create(void)

{
  g_current_test = (Test *)operator_new(0x58);
  g_current_test->failed_ = false;
  g_current_test->assertion_failures_ = 0;
  g_current_test[1]._vptr_Test = (_func_int **)(g_current_test + 2);
  g_current_test[1].failed_ = false;
  *(undefined3 *)&g_current_test[1].field_0x9 = 0;
  g_current_test[1].assertion_failures_ = 0;
  *(undefined1 *)&g_current_test[2]._vptr_Test = 0;
  g_current_test[3]._vptr_Test = (_func_int **)(g_current_test + 4);
  g_current_test[3].failed_ = false;
  *(undefined3 *)&g_current_test[3].field_0x9 = 0;
  g_current_test[3].assertion_failures_ = 0;
  *(undefined1 *)&g_current_test[4]._vptr_Test = 0;
  g_current_test[5]._vptr_Test = (_func_int **)&PTR__FileReader_001fda08;
  g_current_test->_vptr_Test = (_func_int **)&PTR__DiskInterfaceTest_001f9018;
  return g_current_test;
}

Assistant:

TEST_F(DiskInterfaceTest, StatBadPath) {
  string err;
#ifdef _WIN32
  string bad_path("cc:\\foo");
  EXPECT_EQ(-1, disk_.Stat(bad_path, &err));
  EXPECT_NE("", err);
#else
  string too_long_name(512, 'x');
  EXPECT_EQ(-1, disk_.Stat(too_long_name, &err));
  EXPECT_NE("", err);
#endif
}